

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagCode.cpp
# Opt level: O2

span<const_slang::DiagCode,_18446744073709551615UL> slang::findDiagsFromOptionName(string_view name)

{
  iterator iVar1;
  pointer pDVar2;
  size_type sVar3;
  span<const_slang::DiagCode,_18446744073709551615UL> sVar4;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  iVar1 = ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>
          ::find((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>
                  *)optionMap,&local_10);
  if (iVar1.current ==
      (EntryPointer)((long)optionMap[0x11] * 0x30 + optionMap._8_8_ * 0x30 + optionMap._0_8_)) {
    sVar3 = 0;
    pDVar2 = (pointer)0x0;
  }
  else {
    pDVar2 = ((iVar1.current)->field_1).value.second.
             super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = (long)((iVar1.current)->field_1).value.second.
                  super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pDVar2 >> 2;
  }
  sVar4.size_ = sVar3;
  sVar4.data_ = pDVar2;
  return sVar4;
}

Assistant:

span<const DiagCode> findDiagsFromOptionName(string_view name) {
    if (auto it = optionMap.find(name); it != optionMap.end())
        return it->second;
    return {};
}